

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

Inst * __thiscall mir::inst::OpInst::deep_copy(OpInst *this)

{
  OpInst *this_00;
  _Array_type *__vtable;
  anon_class_8_1_a78179b7_conflict local_78;
  VarId local_70;
  Value local_60;
  Value local_40;
  
  this_00 = (OpInst *)operator_new(0x60);
  local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  local_70.id = (this->super_Inst).dest.id;
  local_78.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_60.field_0x8;
  local_60._24_1_ = (this->lhs).field_0x18;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)(char)local_60._24_1_ + 1]._M_data)
            (&local_78,(variant<int,_mir::inst::VarId> *)&(this->lhs).field_0x8);
  local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
  local_60.shift = (this->lhs).shift;
  local_60.shift_amount = (this->lhs).shift_amount;
  local_78.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_40.field_0x8;
  local_40._24_1_ = (this->rhs).field_0x18;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)(char)local_40._24_1_ + 1]._M_data)
            (&local_78,(variant<int,_mir::inst::VarId> *)&(this->rhs).field_0x8);
  local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
  local_40.shift = (this->rhs).shift;
  local_40.shift_amount = (this->rhs).shift_amount;
  OpInst(this_00,&local_70,&local_60,&local_40,this->op);
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new OpInst(dest, lhs, rhs, op); }